

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3VdbeFinalize(Vdbe *p)

{
  int iVar1;
  
  if ((p->magic == 0x319c2973) || (iVar1 = 0, p->magic == 0x2df20da3)) {
    iVar1 = sqlite3VdbeReset(p);
  }
  sqlite3VdbeDelete(p);
  return iVar1;
}

Assistant:

SQLITE_PRIVATE int sqlite3VdbeFinalize(Vdbe *p){
  int rc = SQLITE_OK;
  if( p->magic==VDBE_MAGIC_RUN || p->magic==VDBE_MAGIC_HALT ){
    rc = sqlite3VdbeReset(p);
    assert( (rc & p->db->errMask)==rc );
  }
  sqlite3VdbeDelete(p);
  return rc;
}